

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

int __thiscall
basisu::palette_index_reorderer::init(palette_index_reorderer *this,EVP_PKEY_CTX *ctx)

{
  uint extraout_EAX;
  uint32_t uVar1;
  float *pfVar2;
  uint *puVar3;
  uint in_ECX;
  uint32_t *in_R8;
  double *in_R9;
  float in_XMM0_Da;
  float fVar4;
  uint32_t i_1;
  uint32_t i;
  float side;
  uint32_t entry_to_move;
  double best_count;
  uint32_t best_entry;
  size_t in_stack_ffffffffffffff68;
  uint_vec *i_00;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  uint_vec *in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint_vec *in_stack_ffffffffffffff88;
  palette_index_reorderer *in_stack_ffffffffffffff90;
  vector<unsigned_int> *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar5;
  uint3 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar6;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = (uint32_t)in_stack_ffffffffffffffac;
  if (in_ECX != 0) {
    uVar1 = CONCAT13((uint)ctx != 0,in_stack_ffffffffffffffac);
  }
  if ((char)(uVar1 >> 0x18) == '\0') {
    __assert_fail("(num_syms > 0) && (num_indices > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x4e9,
                  "void basisu::palette_index_reorderer::init(uint32_t, const uint32_t *, uint32_t, pEntry_dist_func, void *, float)"
                 );
  }
  uVar5 = 0.0 <= in_XMM0_Da && in_XMM0_Da <= 1.0;
  if (0.0 > in_XMM0_Da || in_XMM0_Da > 1.0) {
    __assert_fail("(dist_func_weight >= 0.0f) && (dist_func_weight <= 1.0f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x4ea,
                  "void basisu::palette_index_reorderer::init(uint32_t, const uint32_t *, uint32_t, pEntry_dist_func, void *, float)"
                 );
  }
  clear((palette_index_reorderer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  vector<unsigned_int>::resize
            ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (size_t)in_stack_ffffffffffffff78,SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0));
  vector<unsigned_int>::reserve(&this->m_hist,CONCAT17(uVar5,in_stack_ffffffffffffff98));
  vector<unsigned_int>::resize
            ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (size_t)in_stack_ffffffffffffff78,SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0));
  uVar6 = extraout_EAX;
  if (1 < (uint)ctx) {
    prepare_hist(in_stack_ffffffffffffff90,(uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff88,
                 (uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    find_initial((palette_index_reorderer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),uVar1);
    while (uVar1 = vector<unsigned_int>::size(&this->m_entries_to_do), uVar1 != 0) {
      find_next_entry((palette_index_reorderer *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
                      in_R9,(pEntry_dist_func)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),
                      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
      pfVar2 = (float *)vector<unsigned_int>::operator[]
                                  ((vector<unsigned_int> *)
                                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68);
      in_stack_ffffffffffffffbc = *pfVar2;
      fVar4 = pick_side((palette_index_reorderer *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                        (uint32_t)((ulong)in_R8 >> 0x20),(uint32_t)in_R8,(pEntry_dist_func)in_R9,
                        (void *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),
                        in_stack_ffffffffffffffc4);
      if (0.0 < fVar4) {
        this_00 = &this->m_entries_picked;
        vector<unsigned_int>::begin(&this->m_entries_picked);
        vector<unsigned_int>::insert
                  (this_00,(uint *)in_stack_ffffffffffffff88,
                   (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
      else {
        vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (uint *)in_stack_ffffffffffffff78);
      }
      in_stack_ffffffffffffff88 = &this->m_entries_to_do;
      vector<unsigned_int>::begin(&this->m_entries_to_do);
      vector<unsigned_int>::erase
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (uint *)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff84 = 0;
      while (uVar6 = in_stack_ffffffffffffff84,
            uVar1 = vector<unsigned_int>::size(&this->m_entries_to_do),
            in_stack_ffffffffffffff84 < uVar1) {
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff80 =
             get_hist((palette_index_reorderer *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78
                      ,in_stack_ffffffffffffff74);
        in_stack_ffffffffffffff78 = &this->m_total_count_to_picked;
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        puVar3 = vector<unsigned_int>::operator[]
                           ((vector<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff68);
        *puVar3 = in_stack_ffffffffffffff80 + *puVar3;
        in_stack_ffffffffffffff84 = uVar6 + 1;
      }
    }
    uVar6 = 0;
    while (uVar6 < in_ECX) {
      i_00 = &this->m_remap_table;
      uVar7 = uVar6;
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)CONCAT44(uVar6,in_stack_ffffffffffffff70),(size_t)i_00);
      puVar3 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)CONCAT44(uVar6,in_stack_ffffffffffffff70),
                          (size_t)i_00);
      *puVar3 = uVar6;
      uVar6 = uVar7 + 1;
    }
  }
  return uVar6;
}

Assistant:

void palette_index_reorderer::init(uint32_t num_indices, const uint32_t *pIndices, uint32_t num_syms, pEntry_dist_func pDist_func, void *pCtx, float dist_func_weight)
	{
		assert((num_syms > 0) && (num_indices > 0));
		assert((dist_func_weight >= 0.0f) && (dist_func_weight <= 1.0f));

		clear();

		m_remap_table.resize(num_syms);
		m_entries_picked.reserve(num_syms);
		m_total_count_to_picked.resize(num_syms);

		if (num_indices <= 1)
			return;

		prepare_hist(num_syms, num_indices, pIndices);
		find_initial(num_syms);

		while (m_entries_to_do.size())
		{
			// Find the best entry to move into the picked list.
			uint32_t best_entry;
			double best_count;
			find_next_entry(best_entry, best_count, pDist_func, pCtx, dist_func_weight);

			// We now have chosen an entry to place in the picked list, now determine which side it goes on.
			const uint32_t entry_to_move = m_entries_to_do[best_entry];
								
			float side = pick_side(num_syms, entry_to_move, pDist_func, pCtx, dist_func_weight);
								
			// Put entry_to_move either on the "left" or "right" side of the picked entries
			if (side <= 0)
				m_entries_picked.push_back(entry_to_move);
			else
				m_entries_picked.insert(m_entries_picked.begin(), entry_to_move);

			// Erase best_entry from the todo list
			m_entries_to_do.erase(m_entries_to_do.begin() + best_entry);

			// We've just moved best_entry to the picked list, so now we need to update m_total_count_to_picked[] to factor the additional count to best_entry
			for (uint32_t i = 0; i < m_entries_to_do.size(); i++)
				m_total_count_to_picked[m_entries_to_do[i]] += get_hist(m_entries_to_do[i], entry_to_move, num_syms);
		}

		for (uint32_t i = 0; i < num_syms; i++)
			m_remap_table[m_entries_picked[i]] = i;
	}